

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-object.c
# Opt level: O3

pdf_obj * pdf_new_int(hd_context *ctx,pdf_document *doc,int64_t i)

{
  pdf_obj *ppVar1;
  
  ppVar1 = (pdf_obj *)hd_malloc(ctx,0x10);
  ppVar1->refs = 1;
  ppVar1->kind = 'i';
  ppVar1->flags = '\0';
  *(int64_t *)(ppVar1 + 2) = i;
  return ppVar1;
}

Assistant:

pdf_obj *
pdf_new_int(hd_context *ctx, pdf_document *doc, int64_t i)
{
    pdf_obj_num *obj;
    obj = Memento_label(hd_malloc(ctx, sizeof(pdf_obj_num)), "pdf_obj(int)");
    obj->super.refs = 1;
    obj->super.kind = PDF_INT;
    obj->super.flags = 0;
    obj->u.i = i;
    return &obj->super;
}